

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_32777e::Nrom_creation_works_with_correct_rom_sizes_Test::
~Nrom_creation_works_with_correct_rom_sizes_Test
          (Nrom_creation_works_with_correct_rom_sizes_Test *this)

{
  Nrom_creation_works_with_correct_rom_sizes_Test *this_local;
  
  ~Nrom_creation_works_with_correct_rom_sizes_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Nrom, creation_works_with_correct_rom_sizes) {
    std::string bytes{nrom_bytes(1, 1, Mapper::Nrom)};
    std::stringstream ss(bytes);
    std::unique_ptr<IRom> nrom{RomFactory::from_bytes(ss)};
    EXPECT_NE(nullptr, nrom);

    bytes = nrom_bytes(2, 1, Mapper::Nrom);
    ss = std::stringstream(bytes);
    nrom = RomFactory::from_bytes(ss);
    EXPECT_NE(nullptr, nrom);
}